

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O2

Gia_Man_t * Gia_ManMapShrink6(Gia_Man_t *p,int nFanoutMax,int fKeepLevel,int fVerbose)

{
  Vec_Wrd_t *p_00;
  Vec_Int_t *p_01;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  abctime aVar7;
  Shr_Man_t *p_02;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar8;
  ulong uVar9;
  Shr_Fan_t *pSVar10;
  Gia_Obj_t *pObj_00;
  Vec_Int_t *pVVar11;
  abctime aVar12;
  Gia_Man_t *pGVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  word *pwVar18;
  int local_74;
  uint local_70;
  ulong local_68;
  ulong local_60;
  word uTruth1;
  word uTruth0;
  
  aVar7 = Abc_Clock();
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                  ,0x19a,"Gia_Man_t *Gia_ManMapShrink6(Gia_Man_t *, int, int, int)");
  }
  p_02 = Shr_ManAlloc(p);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  iVar15 = 1;
  local_60 = 0;
  local_70 = 0;
  do {
    if ((p->nObjs <= iVar15) || (pObj = Gia_ManObj(p,iVar15), pObj == (Gia_Obj_t *)0x0)) {
      if (fVerbose != 0) {
        printf("Performed %d resubs and %d decomps.  ",local_60,(ulong)local_70);
        iVar15 = 0x85e30d;
        printf("Gain in AIG nodes = %d.  ",(ulong)(uint)(p->nObjs - p_02->pNew->nObjs));
        Abc_Print(iVar15,"%s =","Runtime");
        aVar12 = Abc_Clock();
        Abc_Print(iVar15,"%9.2f sec\n",(double)(aVar12 - aVar7) / 1000000.0);
      }
      pGVar13 = Shr_ManFree(p_02);
      return pGVar13;
    }
    uVar2 = (uint)*(ulong *)pObj;
    if ((uVar2 & 0x9fffffff) == 0x9fffffff) {
      pGVar13 = p_02->pNew;
      pGVar8 = Gia_ManAppendObj(pGVar13);
      uVar9 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar9 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar9 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(pGVar13->vCis->nSize & 0x1fffffff) << 0x20;
      pVVar11 = pGVar13->vCis;
      iVar1 = Gia_ObjId(pGVar13,pGVar8);
      Vec_IntPush(pVVar11,iVar1);
      iVar1 = Gia_ObjId(pGVar13,pGVar8);
      uVar2 = iVar1 * 2;
      pObj->Value = uVar2;
      if (p->vLevels != (Vec_Int_t *)0x0) {
        pGVar13 = p_02->pNew;
        iVar1 = Abc_Lit2Var(uVar2);
        pGVar8 = Gia_ManObj(pGVar13,iVar1);
        uVar2 = Abc_LitIsCompl(uVar2);
        iVar1 = Gia_ObjLevel(p,pObj);
        Gia_ObjSetLevel(pGVar13,(Gia_Obj_t *)((ulong)uVar2 ^ (ulong)pGVar8),iVar1);
      }
    }
    else {
      uVar9 = *(ulong *)pObj & 0x1fffffff;
      if (uVar9 == 0x1fffffff || -1 < (int)uVar2) {
        iVar1 = Vec_IntEntry(p->vMapping,iVar15);
        if (iVar1 != 0) {
          p_02->vLeaves->nSize = 0;
          lVar17 = 0;
          while( true ) {
            pVVar11 = p->vMapping;
            iVar1 = Vec_IntEntry(pVVar11,iVar15);
            iVar1 = Vec_IntEntry(pVVar11,iVar1);
            if (iVar1 <= lVar17) break;
            pVVar11 = p->vMapping;
            uVar2 = Vec_IntEntry(pVVar11,iVar15);
            if (((int)uVar2 < 0) || (pVVar11->nSize <= (int)uVar2)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
            }
            Vec_IntPush(p_02->vLeaves,pVVar11->pArray[(ulong)uVar2 + lVar17 + 1]);
            lVar17 = lVar17 + 1;
          }
          if (6 < p_02->vLeaves->nSize) {
            __assert_fail("Vec_IntSize(pMan->vLeaves) <= 6",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                          ,0x1b0,"Gia_Man_t *Gia_ManMapShrink6(Gia_Man_t *, int, int, int)");
          }
          local_68 = Shr_ManComputeTruth6(p_02->pGia,pObj,p_02->vLeaves,p_02->vTruths);
          if (pObj->Value != 0xffffffff) {
            __assert_fail("pObj->Value == ~0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                          ,0x1b3,"Gia_Man_t *Gia_ManMapShrink6(Gia_Man_t *, int, int, int)");
          }
          if (local_68 + 1 < 2) {
            pObj->Value = (uint)(local_68 == 0xffffffffffffffff);
          }
          else {
            pwVar18 = Truth;
            lVar17 = 0;
            while( true ) {
              if (p_02->vLeaves->nSize <= lVar17) break;
              iVar1 = Vec_IntEntry(p_02->vLeaves,(int)lVar17);
              pGVar8 = Gia_ManObj(p,iVar1);
              if (pGVar8 == (Gia_Obj_t *)0x0) break;
              uVar9 = *pwVar18 ^ local_68;
              if (local_68 == *pwVar18 || uVar9 == 0xffffffffffffffff) {
                uVar2 = Abc_LitNotCond(pGVar8->Value,(uint)(uVar9 == 0xffffffffffffffff));
                pObj->Value = uVar2;
              }
              lVar17 = lVar17 + 1;
              pwVar18 = pwVar18 + 1;
            }
            if (pObj->Value == 0xffffffff) {
              pwVar18 = Truth;
              for (lVar17 = 0; lVar17 < p_02->vLeaves->nSize; lVar17 = lVar17 + 1) {
                iVar1 = Vec_IntEntry(p_02->vLeaves,(int)lVar17);
                pGVar8 = Gia_ManObj(p,iVar1);
                if (pGVar8 == (Gia_Obj_t *)0x0) break;
                iVar1 = Abc_LitIsCompl(pGVar8->Value);
                if (iVar1 != 0) {
                  bVar14 = (byte)(1 << ((byte)lVar17 & 0x1f));
                  local_68 = (~*pwVar18 & local_68) << (bVar14 & 0x3f) |
                             (*pwVar18 & local_68) >> (bVar14 & 0x3f);
                }
                pVVar11 = p_02->vLeaves;
                iVar1 = Abc_Lit2Var(pGVar8->Value);
                Vec_IntWriteEntry(pVVar11,(int)lVar17,iVar1);
                pwVar18 = pwVar18 + 1;
              }
              Abc_Clock();
              local_74 = p_02->nDivMax;
              if (local_74 < 7) {
                __assert_fail("Limit > 6",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                              ,0xe3,"int Shr_ManCollectDivisors(Shr_Man_t *, Vec_Int_t *, int, int)"
                             );
              }
              pVVar11 = p_02->vLeaves;
              p_02->vDivs->nSize = 0;
              p_02->vPrio->nSize = 0;
              Gia_ManIncrementTravId(p_02->pNew);
              for (iVar1 = 0; iVar1 < pVVar11->nSize; iVar1 = iVar1 + 1) {
                iVar3 = Vec_IntEntry(pVVar11,iVar1);
                Vec_IntPush(p_02->vDivs,iVar3);
                Shr_ManDivPushOrderByLevel(p_02,iVar3);
                Gia_ObjSetTravIdCurrentId(p_02->pNew,iVar3);
              }
              iVar1 = 0;
LAB_0062e858:
              if (iVar1 < p_02->vPrio->nSize) {
                iVar3 = Vec_IntEntry(p_02->vPrio,iVar1);
                iVar4 = Gia_ObjIsTravIdCurrentId(p_02->pNew,iVar3);
                if (iVar4 == 0) {
                  __assert_fail("Gia_ObjIsTravIdCurrentId(p->pNew, iDiv)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                                ,0xf0,
                                "int Shr_ManCollectDivisors(Shr_Man_t *, Vec_Int_t *, int, int)");
                }
                iVar4 = Vec_IntEntry(p_02->vObj2Fan,iVar3);
                if (iVar4 == 0) {
                  iVar16 = 0;
                  iVar4 = 0;
                  goto LAB_0062e8ce;
                }
                p_00 = p_02->vFanMem;
                iVar4 = Vec_IntEntry(p_02->vObj2Fan,iVar3);
                pSVar10 = (Shr_Fan_t *)Vec_WrdEntryP(p_00,iVar4);
                iVar16 = 0;
                do {
                  p_02->pFanTemp = pSVar10;
                  iVar4 = pSVar10->iFan;
LAB_0062e8ce:
                  do {
                    if ((iVar4 == 0) || (nFanoutMax == iVar16)) {
                      iVar1 = iVar1 + 1;
                      goto LAB_0062e858;
                    }
                    iVar5 = Gia_ObjIsTravIdCurrentId(p_02->pNew,iVar4);
                    if (iVar5 == 0) {
                      pGVar8 = Gia_ManObj(p_02->pNew,iVar4);
                      if (((int)(uint)*(undefined8 *)pGVar8 < 0) ||
                         (((uint)*(undefined8 *)pGVar8 & 0x1fffffff) == 0x1fffffff)) {
                        __assert_fail("Gia_ObjIsAnd(pFan)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                                      ,0xf8,
                                      "int Shr_ManCollectDivisors(Shr_Man_t *, Vec_Int_t *, int, int)"
                                     );
                      }
                      pGVar13 = p_02->pNew;
                      pObj_00 = Gia_ManObj(pGVar13,iVar3);
                      iVar5 = Gia_ObjLevel(pGVar13,pObj_00);
                      iVar6 = Gia_ObjLevel(p_02->pNew,pGVar8);
                      if (iVar6 <= iVar5) {
                        __assert_fail("Gia_ObjLevel(p->pNew, Gia_ManObj(p->pNew, iDiv)) < Gia_ObjLevel(p->pNew, pFan)"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                                      ,0xf9,
                                      "int Shr_ManCollectDivisors(Shr_Man_t *, Vec_Int_t *, int, int)"
                                     );
                      }
                      iVar5 = Gia_ObjIsTravIdCurrentId
                                        (p_02->pNew,iVar4 - (*(uint *)pGVar8 & 0x1fffffff));
                      if ((iVar5 != 0) &&
                         (iVar5 = Gia_ObjIsTravIdCurrentId
                                            (p_02->pNew,
                                             iVar4 - (*(uint *)&pGVar8->field_0x4 & 0x1fffffff)),
                         iVar5 != 0)) {
                        Vec_IntPush(p_02->vDivs,iVar4);
                        Gia_ObjSetTravIdCurrentId(p_02->pNew,iVar4);
                        iVar4 = Shr_ManDivPushOrderByLevel(p_02,iVar4);
                        if (iVar4 <= iVar1) {
                          __assert_fail("i < iPlace",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                                        ,0x100,
                                        "int Shr_ManCollectDivisors(Shr_Man_t *, Vec_Int_t *, int, int)"
                                       );
                        }
                        if (p_02->vDivs->nSize == local_74) goto LAB_0062ea20;
                      }
                    }
                    iVar5 = p_02->pFanTemp->Next;
                    iVar16 = iVar16 + 1;
                    iVar4 = 0;
                  } while (iVar5 == 0);
                  pSVar10 = (Shr_Fan_t *)Vec_WrdEntryP(p_02->vFanMem,iVar5);
                } while( true );
              }
              local_74 = p_02->vDivs->nSize;
LAB_0062ea20:
              if (p_02->nDivMax < local_74) {
                __assert_fail("nDivs <= pMan->nDivMax",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShrink6.c"
                              ,0x1c6,"Gia_Man_t *Gia_ManMapShrink6(Gia_Man_t *, int, int, int)");
              }
              Abc_Clock();
              Shr_ManComputeTruths
                        (p_02->pNew,p_02->vLeaves->nSize,p_02->vDivs,p_02->vDivTruths,p_02->vTruths)
              ;
              iVar1 = Rsb_ManPerformResub6
                                (p_02->pManRsb,p_02->vLeaves->nSize,local_68,p_02->vDivTruths,
                                 &uTruth0,&uTruth1,0);
              if (iVar1 == 0) {
                uVar2 = Shr_ObjPerformBidec(p_02,p_02->pManDec,p_02->pNew,p_02->vLeaves,local_68,
                                            0xffffffffffffffff);
                pObj->Value = uVar2;
                local_70 = local_70 + 1;
              }
              else {
                pVVar11 = Rsb_ManGetFanins(p_02->pManRsb);
                p_02->vDivResub->nSize = 0;
                for (iVar1 = 0; iVar1 < pVVar11->nSize; iVar1 = iVar1 + 1) {
                  iVar3 = Vec_IntEntry(pVVar11,iVar1);
                  p_01 = p_02->vDivResub;
                  iVar3 = Vec_IntEntry(p_02->vDivs,iVar3);
                  Vec_IntPush(p_01,iVar3);
                }
                uVar2 = Shr_ObjPerformBidec(p_02,p_02->pManDec,p_02->pNew,p_02->vDivResub,uTruth1,
                                            uTruth0 | uTruth1);
                pObj->Value = uVar2;
                local_60 = (ulong)((int)local_60 + 1);
              }
            }
          }
        }
      }
      else {
        pGVar13 = p_02->pNew;
        iVar1 = Abc_LitNotCond(pObj[-uVar9].Value,uVar2 >> 0x1d & 1);
        iVar3 = Abc_Lit2Var(iVar1);
        if (pGVar13->nObjs <= iVar3) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        iVar3 = Abc_Lit2Var(iVar1);
        pGVar8 = Gia_ManObj(pGVar13,iVar3);
        if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && (int)*(uint *)pGVar8 < 0) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        pGVar8 = Gia_ManAppendObj(pGVar13);
        *(ulong *)pGVar8 = *(ulong *)pGVar8 | 0x80000000;
        iVar3 = Gia_ObjId(pGVar13,pGVar8);
        iVar4 = Abc_Lit2Var(iVar1);
        *(ulong *)pGVar8 =
             *(ulong *)pGVar8 & 0xffffffffe0000000 | (ulong)(iVar3 - iVar4 & 0x1fffffff);
        iVar1 = Abc_LitIsCompl(iVar1);
        uVar9 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar9 & 0xffffffffdfffffff | (ulong)(uint)(iVar1 << 0x1d);
        *(ulong *)pGVar8 =
             uVar9 & 0xe0000000dfffffff | (ulong)(uint)(iVar1 << 0x1d) |
             (ulong)(pGVar13->vCos->nSize & 0x1fffffff) << 0x20;
        pVVar11 = pGVar13->vCos;
        iVar1 = Gia_ObjId(pGVar13,pGVar8);
        Vec_IntPush(pVVar11,iVar1);
        if (pGVar13->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(pGVar13,pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff),
                           pGVar8);
        }
        iVar1 = Gia_ObjId(pGVar13,pGVar8);
        pObj->Value = iVar1 * 2;
      }
    }
    iVar15 = iVar15 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManMapShrink6( Gia_Man_t * p, int nFanoutMax, int fKeepLevel, int fVerbose )
{
    Shr_Man_t * pMan;
    Gia_Obj_t * pObj, * pFanin;
    word uTruth, uTruth0, uTruth1;
    int i, k, nDivs, iNode;
    int RetValue, Counter1 = 0, Counter2 = 0;
    abctime clk2, clk = Abc_Clock();
    abctime timeFanout = 0;
    assert( Gia_ManHasMapping(p) );
    pMan = Shr_ManAlloc( p );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pMan->pNew );
            if ( p->vLevels )
                Gia_ObjSetLevel( pMan->pNew, Gia_ObjFromLit(pMan->pNew, Gia_ObjValue(pObj)), Gia_ObjLevel(p, pObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pObj->Value = Gia_ManAppendCo( pMan->pNew, Gia_ObjFanin0Copy(pObj) );
        }
        else if ( Gia_ObjIsLut(p, i) )
        {
            // collect leaves of this gate  
            Vec_IntClear( pMan->vLeaves );
            Gia_LutForEachFanin( p, i, iNode, k )
                Vec_IntPush( pMan->vLeaves, iNode );
            assert( Vec_IntSize(pMan->vLeaves) <= 6 );
            // compute truth table 
            uTruth = Shr_ManComputeTruth6( pMan->pGia, pObj, pMan->vLeaves, pMan->vTruths );
            assert( pObj->Value == ~0 );
            if ( uTruth == 0 || ~uTruth == 0 )
                pObj->Value = Abc_LitNotCond( 0, ~uTruth == 0 );
            else
                Gia_ManForEachObjVec( pMan->vLeaves, p, pFanin, k )
                    if ( uTruth == Truth[k] || ~uTruth == Truth[k] )
                        pObj->Value = Abc_LitNotCond( pFanin->Value, ~uTruth == Truth[k] );
            if ( pObj->Value != ~0 )
                continue;
            // translate into new nodes
            Gia_ManForEachObjVec( pMan->vLeaves, p, pFanin, k )
            {
                if ( Abc_LitIsCompl(pFanin->Value) )
                    uTruth = ((uTruth & Truth[k]) >> (1 << k)) | ((uTruth & ~Truth[k]) << (1 << k));
                Vec_IntWriteEntry( pMan->vLeaves, k, Abc_Lit2Var(pFanin->Value) );
            }
            // compute divisors
            clk2 = Abc_Clock();
            nDivs = Shr_ManCollectDivisors( pMan, pMan->vLeaves, pMan->nDivMax, nFanoutMax );
            assert( nDivs <= pMan->nDivMax );
            timeFanout += Abc_Clock() - clk2;
            // compute truth tables
            Shr_ManComputeTruths( pMan->pNew, Vec_IntSize(pMan->vLeaves), pMan->vDivs, pMan->vDivTruths, pMan->vTruths );
            // perform resubstitution
            RetValue = Rsb_ManPerformResub6( pMan->pManRsb, Vec_IntSize(pMan->vLeaves), uTruth, pMan->vDivTruths, &uTruth0, &uTruth1, 0 );
            if ( RetValue ) // resub exists
            {
                Vec_Int_t * vResult = Rsb_ManGetFanins(pMan->pManRsb);
                Vec_IntClear( pMan->vDivResub );
                Vec_IntForEachEntry( vResult, iNode, k )
                    Vec_IntPush( pMan->vDivResub, Vec_IntEntry(pMan->vDivs, iNode) );
                pObj->Value = Shr_ObjPerformBidec( pMan, pMan->pManDec, pMan->pNew, pMan->vDivResub, uTruth1, uTruth0 | uTruth1 );
                Counter1++;
            }
            else
            {
                pObj->Value = Shr_ObjPerformBidec( pMan, pMan->pManDec, pMan->pNew, pMan->vLeaves, uTruth, ~(word)0 );
                Counter2++;
            }
        }
    }
    if ( fVerbose )
    {
        printf( "Performed %d resubs and %d decomps.  ", Counter1, Counter2 );
        printf( "Gain in AIG nodes = %d.  ", Gia_ManObjNum(p)-Gia_ManObjNum(pMan->pNew) );
        ABC_PRT( "Runtime", Abc_Clock() - clk );
//        ABC_PRT( "Divisors", timeFanout );        
    }
    return Shr_ManFree( pMan );
}